

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

TStatus luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  int iVar1;
  undefined1 local_100 [8];
  lua_longjmp lj;
  l_uint32 oldnCcalls;
  void *ud_local;
  Pfunc f_local;
  lua_State *L_local;
  
  lj._212_4_ = L->nCcalls;
  lj.b[0].__saved_mask.__val[0xf]._0_1_ = '\0';
  local_100 = (undefined1  [8])L->errorJmp;
  L->errorJmp = (lua_longjmp *)local_100;
  iVar1 = _setjmp((__jmp_buf_tag *)&lj);
  if (iVar1 == 0) {
    (*f)(L,ud);
  }
  L->errorJmp = (lua_longjmp *)local_100;
  L->nCcalls = lj._212_4_;
  return (TStatus)lj.b[0].__saved_mask.__val[0xf];
}

Assistant:

TStatus luaD_rawrunprotected (lua_State *L, Pfunc f, void *ud) {
  l_uint32 oldnCcalls = L->nCcalls;
  struct lua_longjmp lj;
  lj.status = LUA_OK;
  lj.previous = L->errorJmp;  /* chain new error handler */
  L->errorJmp = &lj;
  LUAI_TRY(L, &lj, f, ud);  /* call 'f' catching errors */
  L->errorJmp = lj.previous;  /* restore old error handler */
  L->nCcalls = oldnCcalls;
  return lj.status;
}